

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageHandler.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
getString(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *__return_storage_ptr__,Document *value,string *key)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_00;
  Ch *__s;
  MemberIterator itr;
  allocator<char> local_49;
  undefined1 local_48 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  FindMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)local_48,(Ch *)value);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  MemberEnd((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)(local_48 + 8));
  if ((local_48 == (undefined1  [8])local_40._M_dataplus._M_p) ||
     (*(short *)((long)local_48 + 0x1e) == 0)) {
    (__return_storage_ptr__->value)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->value).field_2;
    (__return_storage_ptr__->value)._M_string_length = 0;
    (__return_storage_ptr__->value).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->is_some = false;
  }
  else {
    __s = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetString((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)((long)local_48 + 0x10));
    value_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 8);
    std::__cxx11::string::string<std::allocator<char>>((string *)value_00,__s,&local_49);
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    optional(__return_storage_ptr__,value_00);
    std::__cxx11::string::~string((string *)value_00);
  }
  return __return_storage_ptr__;
}

Assistant:

optional<string> getString (Document &value, const string &key) {
    auto itr = value.FindMember(key.c_str());
    if (itr == value.MemberEnd() || itr->value.IsNull()) {
        return {};
    }
    return { itr->value.GetString() };
}